

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_main.cpp
# Opt level: O1

void R_SetupFreelook(void)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  dVar2 = FocalLengthY;
  if (camera == (AActor *)0x0) {
    dVar1 = 0.0;
  }
  else {
    dVar1 = c_tan(ViewPitch.Degrees * -0.017453292519943295);
    dVar1 = dVar1 * dVar2;
  }
  CenterY = (double)viewheight * 0.5 + dVar1;
  centery = SUB84(CenterY + 6755399441055744.0,0);
  globaluclip = -CenterY * (1.0 / InvZtoScale);
  globaldclip = ((double)viewheight - CenterY) * (1.0 / InvZtoScale);
  fVar8 = (float)FocalLengthY;
  fVar10 = (float)CenterY;
  if (centery < 1) {
    uVar7 = 1;
    if (1 < viewheight) {
      uVar7 = (ulong)(uint)viewheight;
    }
    fVar10 = 0.5 - fVar10;
    uVar5 = 0;
    do {
      yslope[uVar5] = fVar8 / fVar10;
      fVar10 = fVar10 + 1.0;
      uVar5 = uVar5 + 1;
    } while (uVar7 != uVar5);
  }
  else {
    fVar9 = fVar10 + -0.5;
    iVar4 = viewheight - centery;
    if (iVar4 == 0 || viewheight < centery) {
      uVar7 = 1;
      if (1 < viewheight) {
        uVar7 = (ulong)(uint)viewheight;
      }
      uVar5 = 0;
      do {
        yslope[uVar5] = fVar8 / fVar9;
        fVar9 = fVar9 + -1.0;
        uVar5 = uVar5 + 1;
      } while (uVar7 != uVar5);
    }
    else {
      uVar3 = centery & 0x7fffffff;
      uVar7 = 0;
      do {
        yslope[uVar7] = fVar8 / fVar9;
        fVar9 = fVar9 + -1.0;
        uVar7 = uVar7 + 1;
      } while (uVar3 != uVar7);
      iVar6 = (int)uVar7;
      fVar10 = (0.5 - fVar10) + (float)iVar6;
      do {
        yslope[uVar7] = fVar8 / fVar10;
        fVar10 = fVar10 + 1.0;
        uVar7 = uVar7 + 1;
      } while ((uint)(iVar4 + iVar6) != uVar7);
    }
  }
  return;
}

Assistant:

void R_SetupFreelook()
{
	double dy;
		
	if (camera != NULL)
	{
		dy = FocalLengthY * (-ViewPitch).Tan();
	}
	else
	{
		dy = 0;
	}

	CenterY = (viewheight / 2.0) + dy;
	centery = xs_ToInt(CenterY);
	globaluclip = -CenterY / InvZtoScale;
	globaldclip = (viewheight - CenterY) / InvZtoScale;

	//centeryfrac &= 0xffff0000;
	int e, i;

	i = 0;
	e = viewheight;
	float focus = float(FocalLengthY);
	float den;
	float cy = float(CenterY);
	if (i < centery)
	{
		den = cy - i - 0.5f;
		if (e <= centery)
		{
			do {
				yslope[i] = focus / den;
				den -= 1;
			} while (++i < e);
		}
		else
		{
			do {
				yslope[i] = focus / den;
				den -= 1;
			} while (++i < centery);
			den = i - cy + 0.5f;
			do {
				yslope[i] = focus / den;
				den += 1;
			} while (++i < e);
		}
	}
	else
	{
		den = i - cy + 0.5f;
		do {
			yslope[i] = focus / den;
			den += 1;
		} while (++i < e);
	}
}